

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::Version::SharedDtor(MessageLite *self)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  Version *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (Version *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,0x166,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void Version::SharedDtor(MessageLite& self) {
  Version& this_ = static_cast<Version&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.suffix_.Destroy();
  this_._impl_.~Impl_();
}